

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O1

void __thiscall TTD::InflateMap::CleanupAfterInflate(InflateMap *this)

{
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  
  TTDIdentifierDictionary<unsigned_long,_Js::DynamicTypeHandler_*>::Unload(&this->m_handlerMap);
  TTDIdentifierDictionary<unsigned_long,_Js::Type_*>::Unload(&this->m_typeMap);
  TTDIdentifierDictionary<unsigned_long,_Js::GlobalObject_*>::Unload(&this->m_tagToGlobalObjectMap);
  TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*>::Unload
            (&this->m_debuggerScopeHomeBodyMap);
  TTDIdentifierDictionary<unsigned_long,_int>::Unload(&this->m_debuggerScopeChainIndexMap);
  TTDIdentifierDictionary<unsigned_long,_Js::FrameDisplay_*>::Unload(&this->m_environmentMap);
  TTDIdentifierDictionary<unsigned_long,_Memory::WriteBarrierPtr<void>_*>::Unload
            (&this->m_slotArrayMap);
  JsUtil::
  BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_promiseDataMap);
  TTDIdentifierDictionary<unsigned_long,_Js::RecyclableObject_*>::Unload(&this->m_oldObjectMap);
  TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*>::Unload(&this->m_oldFunctionBodyMap);
  JsUtil::
  BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear(&(this->m_propertyReset).
           super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         );
  if ((this->m_oldInflatePinSet).ptr !=
      (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    pBVar1 = Memory::
             RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->m_oldInflatePinSet);
    Memory::
    RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::Unroot(&this->m_oldInflatePinSet,
             (pBVar1->
             super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             ).alloc);
    return;
  }
  return;
}

Assistant:

void InflateMap::CleanupAfterInflate()
    {
        this->m_handlerMap.Unload();
        this->m_typeMap.Unload();
        this->m_tagToGlobalObjectMap.Unload();
        this->m_debuggerScopeHomeBodyMap.Unload();
        this->m_debuggerScopeChainIndexMap.Unload();
        this->m_environmentMap.Unload();
        this->m_slotArrayMap.Unload();
        this->m_promiseDataMap.Clear();

        //We re-use these values (and reset things later) so we don't want to unload them here
        //m_objectMap
        //m_functionBodyMap

        this->m_oldObjectMap.Unload();
        this->m_oldFunctionBodyMap.Unload();
        this->m_propertyReset.Clear();

        if(this->m_oldInflatePinSet != nullptr)
        {
            this->m_oldInflatePinSet.Unroot(this->m_oldInflatePinSet->GetAllocator());
        }
    }